

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

Var * __thiscall
kratos::Generator::var
          (Generator *this,string *var_name,uint32_t width,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size,bool is_signed)

{
  uint32_t uVar1;
  iterator iVar2;
  VarException *this_00;
  shared_ptr<kratos::Var> *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar3 [8];
  basic_string_view<char> bVar4;
  format_args args;
  string_view format_str;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_98;
  undefined1 local_90 [8];
  shared_ptr<kratos::Var> p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  shared_ptr<kratos::Var> v_p;
  uint32_t width_local;
  bool is_signed_local;
  
  v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = width;
  v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       is_signed;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          ::find(&(this->vars_)._M_t,var_name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->vars_)._M_t._M_impl.super__Rb_tree_header) {
    local_68._M_dataplus._M_p = (pointer)this;
    std::
    make_shared<kratos::Var,kratos::Generator*,std::__cxx11::string_const&,unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,bool&>
              ((Generator **)local_90,&local_68,(uint *)var_name,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (bool *)size);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Var>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)&this->vars_,var_name,(shared_ptr<kratos::Var> *)local_90);
    this_01 = &p;
    auVar3 = local_90;
  }
  else {
    get_var((Generator *)local_48,(string *)this);
    uVar1 = (*((IRNode *)local_48)->_vptr_IRNode[7])();
    if ((uVar1 != width) || (*(bool *)((long)local_48 + 0xf0) != is_signed)) {
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (var_name->_M_dataplus)._M_p;
      local_68._M_string_length = var_name->_M_string_length;
      bVar4 = fmt::v7::to_string_view<char,_0>("redefinition of {0} with different width/sign");
      format_str.data_ = (char *)bVar4.size_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      format_str.size_ = 0xd;
      fmt::v7::detail::vformat_abi_cxx11_((string *)local_90,(detail *)bVar4.data_,format_str,args);
      local_98 = (Var *)local_48;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_98;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_68,__l,
                 (allocator_type *)
                 ((long)&v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi + 6));
      VarException::VarException
                (this_00,(string *)local_90,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_68);
      __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = &v_p;
    auVar3 = local_48;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
  return (Var *)auVar3;
}

Assistant:

Var &Generator::var(const std::string &var_name, uint32_t width, const std::vector<uint32_t> &size,
                    bool is_signed) {
    if (vars_.find(var_name) != vars_.end()) {
        auto v_p = get_var(var_name);
        if (v_p->width() != width || v_p->is_signed() != is_signed)
            throw VarException(::format("redefinition of {0} with different width/sign", var_name),
                               {v_p.get()});
        return *v_p;
    }
    auto p = std::make_shared<Var>(this, var_name, width, size, is_signed);
    vars_.emplace(var_name, p);
    return *p;
}